

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::SQVM(SQVM *this,SQSharedState *ss)

{
  SQSharedState *ss_local;
  SQVM *this_local;
  
  SQCollectable::SQCollectable(&this->super_SQCollectable);
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQVM_002156d8;
  sqvector<SQObjectPtr>::sqvector(&this->_stack);
  ::SQObjectPtr::SQObjectPtr(&this->_roottable);
  ::SQObjectPtr::SQObjectPtr(&this->_lasterror);
  ::SQObjectPtr::SQObjectPtr(&this->_errorhandler);
  ::SQObjectPtr::SQObjectPtr(&this->_debughook_closure);
  ::SQObjectPtr::SQObjectPtr(&this->temp_reg);
  sqvector<SQVM::CallInfo>::sqvector(&this->_callstackdata);
  sqvector<SQExceptionTrap>::sqvector(&this->_etraps);
  this->_sharedstate = ss;
  this->_suspended = 0;
  this->_suspended_target = -1;
  this->_suspended_root = 0;
  this->_suspended_traps = -1;
  this->_foreignptr = (SQUserPointer)0x0;
  this->_nnativecalls = 0;
  this->_nmetamethodscall = 0;
  ::SQObjectPtr::Null(&this->_lasterror);
  ::SQObjectPtr::Null(&this->_errorhandler);
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  ::SQObjectPtr::Null(&this->_debughook_closure);
  this->_openouters = (SQOuter *)0x0;
  this->ci = (CallInfo *)0x0;
  this->_releasehook = (SQRELEASEHOOK)0x0;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  this->_sharedstate = ss;
  SQCollectable::AddToChain(&this->_sharedstate->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQVM::SQVM(SQSharedState *ss)
{
    _sharedstate=ss;
    _suspended = SQFalse;
    _suspended_target = -1;
    _suspended_root = SQFalse;
    _suspended_traps = -1;
    _foreignptr = NULL;
    _nnativecalls = 0;
    _nmetamethodscall = 0;
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    _openouters = NULL;
    ci = NULL;
    _releasehook = NULL;
    INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
}